

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O0

bool __thiscall
BackgroundParser::Process
          (BackgroundParser *this,Job *job,Parser *parser,CompileScriptException *pse)

{
  code *pcVar1;
  bool bVar2;
  HRESULT hr_00;
  uint blockId;
  BackgroundParseItem *pBVar3;
  undefined4 *puVar4;
  ParseNodeFnc *pnodeFnc;
  ParseContext *parseContext;
  HRESULT hr;
  BackgroundParseItem *backgroundItem;
  CompileScriptException *pse_local;
  Parser *parser_local;
  Job *job_local;
  BackgroundParser *this_local;
  
  pBVar3 = Parser::GetCurrBackgroundParseItem(parser);
  if (pBVar3 != (BackgroundParseItem *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BackgroundParser.cpp"
                       ,0x5e,"(parser->GetCurrBackgroundParseItem() == nullptr)",
                       "parser->GetCurrBackgroundParseItem() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  Parser::SetCurrBackgroundParseItem(parser,(BackgroundParseItem *)job);
  BackgroundParseItem::SetParser((BackgroundParseItem *)job,parser);
  pnodeFnc = BackgroundParseItem::GetParseNode((BackgroundParseItem *)job);
  parseContext = BackgroundParseItem::GetParseContext((BackgroundParseItem *)job);
  bVar2 = BackgroundParseItem::IsDeferred((BackgroundParseItem *)job);
  hr_00 = Parser::ParseFunctionInBackground(parser,pnodeFnc,parseContext,bVar2,pse);
  blockId = Parser::GetLastBlockId(parser);
  BackgroundParseItem::SetMaxBlockId((BackgroundParseItem *)job,blockId);
  BackgroundParseItem::SetHR((BackgroundParseItem *)job,hr_00);
  if (hr_00 < 0) {
    BackgroundParseItem::SetPSE((BackgroundParseItem *)job,pse);
  }
  BackgroundParseItem::SetCompleted((BackgroundParseItem *)job,true);
  Parser::SetCurrBackgroundParseItem(parser,(BackgroundParseItem *)0x0);
  return hr_00 == 0;
}

Assistant:

bool BackgroundParser::Process(JsUtil::Job *const job, Parser *parser, CompileScriptException *pse)
{
    BackgroundParseItem *backgroundItem = static_cast<BackgroundParseItem*>(job);

    Assert(parser->GetCurrBackgroundParseItem() == nullptr);
    parser->SetCurrBackgroundParseItem(backgroundItem);
    backgroundItem->SetParser(parser);

    HRESULT hr = parser->ParseFunctionInBackground(backgroundItem->GetParseNode(), backgroundItem->GetParseContext(), backgroundItem->IsDeferred(), pse);
    backgroundItem->SetMaxBlockId(parser->GetLastBlockId());
    backgroundItem->SetHR(hr);
    if (FAILED(hr))
    {
        backgroundItem->SetPSE(pse);
    }
    backgroundItem->SetCompleted(true);
    parser->SetCurrBackgroundParseItem(nullptr);
    return hr == S_OK;
}